

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,int param_4,
          MPI_Datatype param_5,size_t param_6)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  size_type_conflict sVar5;
  reference piVar6;
  reference pvVar7;
  reference pvVar8;
  MPI_Comm poVar9;
  iterator iVar10;
  iterator iVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  long local_d0;
  size_t bucket_size_1;
  size_t i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pos_1;
  allocator<int> local_99;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> all_samples;
  size_t bucket_size;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pos;
  allocator<int> local_56;
  undefined1 local_55;
  int local_54;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_50;
  int p;
  impl *local_48;
  ulong local_40;
  size_t local_size;
  MPI_Datatype mpi_dt_local;
  comm *comm_local;
  int s_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  vector<int,_std::allocator<int>_> *local_splitters;
  
  _Stack_50._M_current = begin._M_current;
  local_48 = this;
  local_size = param_6;
  mpi_dt_local = param_5;
  comm_local._0_4_ = param_4;
  _s_local = begin._M_current;
  end_local._M_current = (int *)this;
  local_40 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,
                        begin);
  if (local_40 == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xa9,"sample_block_decomp");
  }
  local_54 = mxx::comm::size((comm *)mpi_dt_local);
  local_55 = 0;
  sVar5 = (size_type_conflict)(int)comm_local;
  std::allocator<int>::allocator(&local_56);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar5,&local_56);
  std::allocator<int>::~allocator(&local_56);
  i = (size_t)end_local._M_current;
  for (bucket_size = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__)
      , bucket_size < sVar5; bucket_size = bucket_size + 1) {
    all_samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(local_40 / (ulong)(long)((int)comm_local + 1) +
                  (long)(int)(uint)(bucket_size < local_40 % (ulong)(long)((int)comm_local + 1)));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+=
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i,
               (long)all_samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + -1);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    iVar4 = *piVar6;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,bucket_size);
    *pvVar7 = iVar4;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
  }
  iVar4 = mxx::comm::rank((comm *)mpi_dt_local);
  if (iVar4 == 0) {
    iVar4 = local_54 * (int)comm_local;
    std::allocator<int>::allocator(&local_99);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,(long)iVar4,&local_99);
    std::allocator<int>::~allocator(&local_99);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
    iVar4 = (int)comm_local;
    sVar1 = local_size;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_98,0);
    iVar3 = (int)comm_local;
    sVar2 = local_size;
    poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)mpi_dt_local);
    MPI_Gather(pvVar7,iVar4,sVar1,pvVar8,iVar3,sVar2,0,poVar9);
    iVar10 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_98);
    iVar11 = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_98);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (iVar10._M_current,iVar11._M_current);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
    if (sVar5 != (long)local_54 - 1U) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(long)(local_54 + -1));
    }
    i_1 = (size_t)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_98);
    for (bucket_size_1 = 0; sVar1 = bucket_size_1,
        sVar5 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__), sVar1 < sVar5;
        bucket_size_1 = bucket_size_1 + 1) {
      local_d0 = (long)(int)((local_54 * (int)comm_local) / local_54 +
                            (uint)(bucket_size_1 <
                                  (ulong)(long)((local_54 * (int)comm_local) % local_54)));
      local_d8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i_1
                           ,local_d0 + -1);
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_d8);
      iVar4 = *piVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,bucket_size_1);
      *pvVar7 = iVar4;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+=
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i_1,local_d0)
      ;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  else {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
    iVar4 = (int)comm_local;
    sVar1 = local_size;
    poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)mpi_dt_local);
    MPI_Gather(pvVar7,iVar4,sVar1,0,0,sVar1,0,poVar9);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
    if (sVar5 != (long)local_54 - 1U) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(long)(local_54 + -1));
    }
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  sVar1 = local_size;
  poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)mpi_dt_local);
  MPI_Bcast(pvVar7,sVar5 & 0xffffffff,sVar1,0,poVar9);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}